

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O2

void __thiscall antlr::CharScanner::~CharScanner(CharScanner *this)

{
  (this->super_TokenStream)._vptr_TokenStream = (_func_int **)&PTR___cxa_pure_virtual_002c3070;
  RefCount<antlr::LexerInputState>::~RefCount(&this->inputState);
  TokenRefCount<antlr::Token>::~TokenRefCount(&this->_returnToken);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_antlr::CharScannerLiteralsLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->literals)._M_t);
  std::__cxx11::string::~string((string *)&this->text);
  return;
}

Assistant:

virtual ~CharScanner()
	{
	}